

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

void __thiscall
slang::ast::SolveBeforeConstraint::serializeTo
          (SolveBeforeConstraint *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "solve";
  name._M_len = 5;
  ASTSerializer::startArray(serializer,name);
  ppEVar1 = (this->solve)._M_ptr;
  sVar2 = (this->solve)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  name_00._M_str = "after";
  name_00._M_len = 5;
  ASTSerializer::startArray(serializer,name_00);
  ppEVar1 = (this->after)._M_ptr;
  sVar2 = (this->after)._M_extent._M_extent_value;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void SolveBeforeConstraint::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("solve");
    for (auto item : solve)
        serializer.serialize(*item);
    serializer.endArray();

    serializer.startArray("after");
    for (auto item : after)
        serializer.serialize(*item);
    serializer.endArray();
}